

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int greatest_name_match(char *name,char *filter)

{
  int iVar1;
  size_t __n;
  size_t filter_len;
  size_t offset;
  char *filter_local;
  char *name_local;
  
  filter_len = 0;
  __n = strlen(filter);
  while( true ) {
    if (name[filter_len] == '\0') {
      return 0;
    }
    if ((name[filter_len] == *filter) && (iVar1 = strncmp(name + filter_len,filter,__n), iVar1 == 0)
       ) break;
    filter_len = filter_len + 1;
  }
  return 1;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}